

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

bool llvm::AArch64::getArchFeatures
               (ArchKind AK,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  StringRef local_18;
  
  switch(AK) {
  case ARMV8_1A:
    local_18.Data = "+v8.1a";
    break;
  case ARMV8_2A:
    local_18.Data = "+v8.2a";
    break;
  case ARMV8_3A:
    local_18.Data = "+v8.3a";
    break;
  case ARMV8_4A:
    local_18.Data = "+v8.4a";
    break;
  default:
    goto switchD_0016fb8f_default;
  }
  local_18.Length = 6;
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::emplace_back<llvm::StringRef>
            (Features,&local_18);
switchD_0016fb8f_default:
  return AK != INVALID;
}

Assistant:

bool llvm::AArch64::getArchFeatures(AArch64::ArchKind AK,
                                    std::vector<StringRef> &Features) {
  if (AK == AArch64::ArchKind::ARMV8_1A)
    Features.push_back("+v8.1a");
  if (AK == AArch64::ArchKind::ARMV8_2A)
    Features.push_back("+v8.2a");
  if (AK == AArch64::ArchKind::ARMV8_3A)
    Features.push_back("+v8.3a");
  if (AK == AArch64::ArchKind::ARMV8_4A)
    Features.push_back("+v8.4a");

  return AK != AArch64::ArchKind::INVALID;
}